

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  __u32 _Var2;
  bool bVar3;
  isobusfs_srv_priv *piVar4;
  __time_t _Var5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  isobusfs_srv_priv_conflict *piVar10;
  char *__string;
  size_t sVar11;
  epoll_event *peVar12;
  isobusfs_msg *msg;
  int *piVar13;
  isobusfs_srv_client *piVar14;
  bool bVar15;
  void *pvVar16;
  wchar_t *pwVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined1 *puVar20;
  timespec *optarg;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint n;
  isobusfs_srv_volume_conflict *piVar26;
  _Bool *p_Var27;
  char **ppcVar28;
  bool bVar29;
  ulong uVar30;
  int writeable_volumes_count;
  char **writeable_volumes;
  uint32_t local_address;
  int long_index;
  timespec ts;
  uint64_t local_name;
  isobusfs_srv_priv_conflict *local_210;
  ulong local_208;
  wchar_t local_1f4;
  isobusfs_srv_volume_conflict *local_1f0;
  isobusfs_buf_log *local_1e8;
  timespec local_1e0;
  sockaddr_can_conflict *local_1d0;
  wchar_t *local_1c8;
  undefined4 local_1bc;
  timespec local_1b8;
  uint64_t local_1a8;
  _Bool *local_1a0;
  sockaddr_can local_198 [15];
  
  piVar10 = (isobusfs_srv_priv_conflict *)calloc(1,0x16c2c0);
  if (piVar10 != (isobusfs_srv_priv_conflict *)0x0) {
    local_1d0 = &piVar10->addr;
    libj1939_init_sockaddr_can((sockaddr_can *)local_1d0,0x40000);
    piVar10->server_version = L'\x04';
    local_1b8.tv_sec = 0;
    local_1e0.tv_sec = 0;
    local_1e0.tv_nsec._4_4_ = 0;
    local_1a8 = 0;
    local_1f4 = L'\0';
    local_1e8 = (isobusfs_buf_log *)0x0;
    local_1bc = 0;
    memcpy(local_198,&PTR_anon_var_dwarf_81_0010bc60,0x160);
    local_1f0 = piVar10->volumes;
    local_1c8 = &piVar10->removable_volumes_count;
    bVar29 = false;
    bVar15 = false;
    bVar3 = false;
LAB_001028f0:
    do {
      iVar6 = getopt_long(argc,argv,"a:d:i:l:n:r:s:v:w:h",local_198,&local_1bc);
      switch((int *)(ulong)(iVar6 - 100)) {
      case (int *)0x0:
        pcVar21 = strdup((char *)_optarg);
        piVar10->default_volume = pcVar21;
        goto LAB_001028f0;
      case (int *)0x1:
      case (int *)0x2:
      case (int *)0x3:
      case (int *)0x4:
      case (int *)0x6:
      case (int *)0x7:
      case (int *)0x9:
      case (int *)0xb:
      case (int *)0xc:
      case (int *)0xd:
      case (int *)0x10:
      case (int *)0x11:
        goto switchD_0010291d_caseD_1;
      case (int *)0x5:
        wVar9 = if_nametoindex((char *)_optarg);
        (piVar10->addr).can_ifindex = wVar9;
        piVar4 = _optarg;
        bVar15 = true;
        if (wVar9 == L'\0') {
          piVar13 = __errno_location();
          iVar6 = *piVar13;
          pcVar21 = strerror(iVar6);
          isobusfs_log(1,"Interface %s not found. Error: %d (%s)\n",piVar4,iVar6,pcVar21);
          return -0x16;
        }
        goto LAB_001028f0;
      case (int *)0x8:
        uVar30 = strtoul((char *)_optarg,(char **)0x0,0);
        if ((int)uVar30 - 5U < 0xfffffffc) {
          isobusfs_log(1,"invalid debug level %d",uVar30 & 0xffffffff);
        }
        isobusfs_log_level_set(uVar30 & 0xffffffff);
        goto LAB_001028f0;
      case (int *)0xa:
        if (bVar3) goto LAB_00102bd2;
        __isoc99_sscanf(_optarg,"%lx",&local_1a8);
        piVar10->local_name = local_1a8;
        (piVar10->addr).can_addr.j1939.name = local_1a8;
        local_1e8 = (isobusfs_buf_log *)CONCAT71((int7)(local_1a8 >> 8),1);
        goto LAB_001028f0;
      case (int *)0xe:
        optarg = &local_1b8;
        pwVar17 = local_1c8;
        break;
      case (int *)0xf:
        uVar7 = atoi((char *)_optarg);
        if (0xff < uVar7) {
          isobusfs_log(1,"Invalid server version %d. Using default version: %d",uVar7,4);
        }
        goto LAB_001028f0;
      case (int *)0x12:
        if (L'\t' < piVar10->volume_count) {
          isobusfs_log(1,"Maximum number of volumes (%d) exceeded\n",10);
          return -0x16;
        }
        pcVar21 = strdup((char *)_optarg);
        pcVar22 = strtok(pcVar21,":");
        __string = strtok((char *)0x0,":");
        if ((pcVar22 == (char *)0x0) || (__string == (char *)0x0)) {
          isobusfs_log(1,"Error: volume or path name is missing\n");
        }
        else {
          sVar11 = strnlen(pcVar22,0x100);
          if (sVar11 < 0xff) {
            sVar11 = strnlen(__string,0x1002);
            if (sVar11 < 0x1001) {
              pcVar22 = strdup(pcVar22);
              piVar26 = local_1f0;
              local_1f0[piVar10->volume_count].name = pcVar22;
              pcVar22 = strdup(__string);
              wVar9 = piVar10->volume_count;
              piVar26[wVar9].path = pcVar22;
              piVar10->volume_count = wVar9 + L'\x01';
              free(pcVar21);
              bVar29 = true;
              goto LAB_001028f0;
            }
            pcVar22 = "Error: Path name exceeds maximum length (%d)\n";
            uVar18 = 0x1000;
          }
          else {
            pcVar22 = "Error: Volume name exceeds maximum length (%d)\n";
            uVar18 = 0xfe;
          }
          isobusfs_log(1,pcVar22,uVar18);
        }
        free(pcVar21);
        return -0x16;
      case (int *)0x13:
        optarg = &local_1e0;
        pwVar17 = &local_1f4;
        break;
      default:
        if (iVar6 != 0x61) {
          if (iVar6 != -1) goto switchD_0010291d_caseD_1;
          if ((!bVar3) && (((ulong)local_1e8 & 1) == 0)) {
            pcVar21 = "Error: local address or local name is missing";
            goto LAB_00102c96;
          }
          if (bVar29) {
            if (!bVar15) {
              pcVar21 = "Error: interface is missing";
              goto LAB_00102c96;
            }
            wVar9 = piVar10->volume_count;
            uVar30 = (ulong)(uint)wVar9;
            if (uVar30 == 1) {
              if (piVar10->default_volume != (char *)0x0) {
                pcVar21 = "Error: default volume is not needed for single volume";
                goto LAB_00102c96;
              }
              pcVar21 = strdup(piVar10->volumes[0].name);
              piVar10->default_volume = pcVar21;
              wVar8 = piVar10->removable_volumes_count;
              if (L'\0' < wVar8) {
                uVar24 = 1;
                goto LAB_00102d8b;
              }
              if (local_1f4 < L'\x01') {
                local_208 = (ulong)(uint)local_1f4;
                bVar15 = false;
                goto LAB_00102ef9;
              }
              uVar30 = 1;
              goto LAB_00102e49;
            }
            if (wVar9 != L'\0') {
              if (wVar9 < L'\x02') goto LAB_00102d3c;
              pcVar21 = piVar10->default_volume;
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "Error: default volume is missing";
                goto LAB_00102c96;
              }
              iVar6 = strcmp(pcVar21,local_1f0->name);
              if (iVar6 == 0) goto LAB_00102d3c;
              lVar25 = 0;
              goto LAB_00102d15;
            }
          }
          pcVar21 = "Error: volume is missing";
          goto LAB_00102c96;
        }
        if (((ulong)local_1e8 & 1) != 0) {
LAB_00102bd2:
          isobusfs_log(1,"Both local address and local name provided, they are mutually exclusive\n"
                      );
          return -0x16;
        }
        __isoc99_sscanf(_optarg,"%x",(undefined1 *)((long)&local_1e0.tv_nsec + 4));
        (piVar10->addr).can_addr.j1939.addr = local_1e0.tv_nsec._4_1_;
        bVar3 = true;
        goto LAB_001028f0;
      }
      iVar6 = isobusfs_srv_parse_volume_ext
                        (_optarg,(char *)optarg,(char ***)pwVar17,(int *)(ulong)(iVar6 - 100));
      if (iVar6 < 0) {
        return iVar6;
      }
    } while( true );
  }
  err(1,"can\'t allocate priv");
  goto LAB_00103374;
  while (iVar6 = strcmp(pcVar21,*(char **)((long)piVar10->volumes[1].clients + lVar25 + -0x18)),
        lVar25 = lVar25 + 0x780, iVar6 != 0) {
LAB_00102d15:
    if ((ulong)(uint)(wVar9 + L'\xffffffff') * 0x780 + 0x780 == lVar25 + 0x780) {
      pcVar21 = "Error: default volume should be one of defined volumes";
LAB_00102c96:
      isobusfs_log(1,pcVar21);
      goto switchD_0010291d_caseD_1;
    }
  }
LAB_00102d3c:
  wVar8 = *local_1c8;
  if (L'\0' < wVar8) {
    uVar24 = uVar30;
    if (wVar9 < L'\x01') {
      uVar19 = 0;
      pvVar16 = (void *)local_1b8.tv_sec;
LAB_00102e22:
      uVar18 = *(undefined8 *)((long)pvVar16 + uVar19 * 8);
      pcVar21 = "Error: removable volume %s is not defined";
      goto LAB_00102ee2;
    }
LAB_00102d8b:
    pvVar16 = (void *)local_1b8.tv_sec;
    local_1f0 = (isobusfs_srv_volume_conflict *)&piVar10->volumes[0].removable;
    uVar19 = 0;
    do {
      pcVar21 = *(char **)((long)pvVar16 + uVar19 * 8);
      uVar23 = uVar24;
      piVar26 = local_1f0;
      while (iVar6 = strcmp(pcVar21,*(char **)((long)(piVar26 + -1) + 0x770)), iVar6 != 0) {
        piVar26 = piVar26 + 1;
        uVar23 = uVar23 - 1;
        if (uVar23 == 0) {
          uVar19 = uVar19 & 0xffffffff;
          goto LAB_00102e22;
        }
      }
      *(undefined1 *)&piVar26->name = 1;
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)wVar8);
  }
  if (local_1f4 < L'\x01') {
    bVar15 = false;
    wVar8 = local_1f4;
  }
  else {
    if (wVar9 < L'\x01') {
      uVar30 = 0;
      pvVar16 = (void *)local_1e0.tv_sec;
LAB_00102ed7:
      uVar18 = *(undefined8 *)((long)pvVar16 + uVar30 * 8);
      pcVar21 = "Error: writeable volume %s is not defined";
LAB_00102ee2:
      isobusfs_log(1,pcVar21,uVar18);
switchD_0010291d_caseD_1:
      isobusfs_srv_print_help();
      return -0x16;
    }
LAB_00102e49:
    pvVar16 = (void *)local_1e0.tv_sec;
    wVar8 = local_1f4;
    local_1f0 = (isobusfs_srv_volume_conflict *)(ulong)(uint)local_1f4;
    local_1a0 = &piVar10->volumes[0].writeable;
    puVar20 = (undefined1 *)0x0;
    do {
      pcVar21 = *(char **)((long)pvVar16 + (long)puVar20 * 8);
      uVar24 = uVar30;
      p_Var27 = local_1a0;
      while (iVar6 = strcmp(pcVar21,((isobusfs_srv_volume_conflict *)(p_Var27 + -0x11))->name),
            iVar6 != 0) {
        p_Var27 = p_Var27 + 0x780;
        uVar24 = uVar24 - 1;
        if (uVar24 == 0) {
          uVar30 = (ulong)puVar20 & 0xffffffff;
          goto LAB_00102ed7;
        }
      }
      *p_Var27 = true;
      puVar20 = puVar20 + 1;
    } while ((isobusfs_srv_volume_conflict *)puVar20 != local_1f0);
    bVar15 = true;
  }
  local_208 = (ulong)(uint)wVar8;
  if (L'\0' < wVar9) {
LAB_00102ef9:
    ppcVar28 = &piVar10->volumes[0].path;
    lVar25 = 0;
    do {
      iVar6 = isobusfs_cmn_dh_validate_dir_path(*ppcVar28,*(_Bool *)((long)ppcVar28 + 9));
      if (iVar6 < 0) {
        if (iVar6 == -0xd) {
          pcVar21 = *ppcVar28;
          pcVar22 = strerror(-0xd);
          isobusfs_log(1,"Error: can\'t access path %s, error %i (%s)",pcVar21,0xfffffff3,pcVar22);
        }
        else if (iVar6 == -0x14) {
          isobusfs_log(1,"Error: path %s is not a directory",*ppcVar28);
        }
        if (*(_Bool *)(ppcVar28 + 1) != true) {
          return iVar6;
        }
      }
      lVar25 = lVar25 + 1;
      ppcVar28 = ppcVar28 + 0xf0;
    } while (lVar25 < piVar10->volume_count);
  }
  if (((ulong)local_1e8 & 1) == 0) {
    isobusfs_log(2,
                 "local name is not set. Wont be able to generate proper manufacturer-specific directory name. Falling mack to MCMC0000"
                );
  }
  snprintf(piVar10->mfs_dir,9,"MCMC%04u",(ulong)((uint)piVar10->local_name >> 0x15));
  isobusfs_log(4,"Server configuration:");
  isobusfs_log(4,"  local NAME: 0x%lx",piVar10->local_name);
  isobusfs_log(4,"  manufacturer-specific directory: %s",piVar10->mfs_dir);
  isobusfs_log(4,"Configured volumes:");
  if (L'\0' < piVar10->volume_count) {
    p_Var27 = &piVar10->volumes[0].writeable;
    lVar25 = 0;
    do {
      isobusfs_log(4,"  %s: %s",((isobusfs_srv_volume_conflict *)(p_Var27 + -0x11))->name,
                   *(char **)(p_Var27 + -9));
      pcVar21 = "read-only";
      if (*p_Var27 != false) {
        pcVar21 = "writeable";
      }
      isobusfs_log(4,"    %s",pcVar21);
      pcVar21 = "non-removable";
      if (p_Var27[-1] != false) {
        pcVar21 = "removable";
      }
      isobusfs_log(4,"    %s",pcVar21);
      lVar25 = lVar25 + 1;
      p_Var27 = p_Var27 + 0x780;
    } while (lVar25 < piVar10->volume_count);
  }
  _Var5 = local_1b8.tv_sec;
  pwVar17 = local_1c8;
  if (L'\0' < *local_1c8) {
    lVar25 = 0;
    do {
      free(*(void **)(_Var5 + lVar25 * 8));
      lVar25 = lVar25 + 1;
    } while (lVar25 < *pwVar17);
  }
  free((void *)_Var5);
  _Var5 = local_1e0.tv_sec;
  if (bVar15) {
    uVar30 = 0;
    do {
      free(*(void **)(_Var5 + uVar30 * 8));
      uVar30 = uVar30 + 1;
    } while (local_208 != uVar30);
  }
  free((void *)_Var5);
  wVar9 = libj1939_create_epoll();
  if (wVar9 < L'\0') {
    return wVar9;
  }
  (piVar10->cmn).epoll_fd = wVar9;
  peVar12 = (epoll_event *)calloc(0x100,0xc);
  (piVar10->cmn).epoll_events = peVar12;
  if (peVar12 == (epoll_event *)0x0) {
    return -0xc;
  }
  (piVar10->cmn).epoll_events_size = 0x100;
  local_198[0].can_addr._8_8_ = *(undefined8 *)((long)&local_1d0->can_addr + 8);
  local_198[0].can_family = local_1d0->can_family;
  local_198[0]._2_2_ = *(undefined2 *)&local_1d0->field_0x2;
  local_198[0].can_ifindex = local_1d0->can_ifindex;
  local_198[0].can_addr._0_8_ = (local_1d0->can_addr).tp;
  wVar9 = libj1939_open_socket();
  if (wVar9 < L'\0') {
    return wVar9;
  }
  piVar10->sock_fss = wVar9;
  iVar6 = isobusfs_cmn_configure_error_queue(wVar9);
  if (iVar6 < 0) {
    return iVar6;
  }
  local_198[0].can_addr._8_4_ = 0xaa00;
  iVar6 = libj1939_bind_socket(piVar10->sock_fss,local_198);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = libj1939_set_broadcast(piVar10->sock_fss);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = isobusfs_cmn_set_linger(piVar10->sock_fss);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = libj1939_socket_prio(piVar10->sock_fss,5);
  if (iVar6 < 0) {
    return iVar6;
  }
  local_198[0].can_addr.j1939.name = 0;
  local_198[0].can_addr._8_5_ = 0xff00000000;
  local_198[0].can_addr._8_4_ = 0xab00;
  iVar6 = isobusfs_cmn_connect_socket(piVar10->sock_fss);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = libj1939_add_socket_to_epoll((piVar10->cmn).epoll_fd,piVar10->sock_fss,8);
  if (iVar6 < 0) {
    return iVar6;
  }
  local_198[0].can_addr._8_8_ = *(undefined8 *)((long)&local_1d0->can_addr + 8);
  local_198[0].can_family = local_1d0->can_family;
  local_198[0]._2_2_ = *(undefined2 *)&local_1d0->field_0x2;
  local_198[0].can_ifindex = local_1d0->can_ifindex;
  local_198[0].can_addr._0_8_ = (local_1d0->can_addr).tp;
  wVar9 = libj1939_open_socket();
  if (wVar9 < L'\0') {
    return wVar9;
  }
  piVar10->sock_in = wVar9;
  local_198[0].can_addr._8_4_ = 0xaa00;
  iVar6 = libj1939_bind_socket(wVar9,local_198);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = libj1939_add_socket_to_epoll((piVar10->cmn).epoll_fd,piVar10->sock_in,1);
  if (iVar6 < 0) {
    return iVar6;
  }
  local_198[0].can_addr._8_8_ = *(undefined8 *)((long)&local_1d0->can_addr + 8);
  local_198[0].can_family = local_1d0->can_family;
  local_198[0]._2_2_ = *(undefined2 *)&local_1d0->field_0x2;
  local_198[0].can_ifindex = local_1d0->can_ifindex;
  local_198[0].can_addr._0_8_ = (local_1d0->can_addr).tp;
  wVar9 = libj1939_open_socket();
  if (wVar9 < L'\0') {
    return wVar9;
  }
  piVar10->sock_nack = wVar9;
  local_198[0].can_addr._8_4_ = 0xe800;
  iVar6 = libj1939_bind_socket(wVar9,local_198);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = libj1939_socket_prio(piVar10->sock_nack,6);
  if (iVar6 < 0) {
    return iVar6;
  }
  iVar6 = libj1939_add_socket_to_epoll((piVar10->cmn).epoll_fd,piVar10->sock_nack,1);
  local_210 = piVar10;
  if (iVar6 != 0) {
    return iVar6;
  }
LAB_00103374:
  isobusfs_srv_fss_init((isobusfs_srv_priv *)local_210);
  isobusfs_srv_init_clients((isobusfs_srv_priv *)local_210);
  clock_gettime(1,&local_1b8);
  *(undefined4 *)&(local_210->cmn).next_send_time.tv_sec = (undefined4)local_1b8.tv_sec;
  *(undefined4 *)((long)&(local_210->cmn).next_send_time.tv_sec + 4) = local_1b8.tv_sec._4_4_;
  *(undefined4 *)&(local_210->cmn).next_send_time.tv_nsec = (undefined4)local_1b8.tv_nsec;
  *(undefined4 *)((long)&(local_210->cmn).next_send_time.tv_nsec + 4) = local_1b8.tv_nsec._4_4_;
  isobusfs_log(3,"Starting isobusfs-srv");
  local_1e8 = &local_210->tx_buf_log;
  do {
    iVar6 = libj1939_prepare_for_events((libj1939_cmn *)&local_210->cmn,(int *)&local_1e0,false);
    if (iVar6 != 0) break;
    uVar30 = (ulong)(int)local_1e0.tv_sec;
    if (0 < (long)uVar30) {
      lVar25 = 4;
      uVar24 = 0;
      do {
        if ((local_210->cmn).epoll_events_size <= uVar24) break;
        peVar12 = (local_210->cmn).epoll_events;
        uVar7 = *(uint *)((long)peVar12 + lVar25 + -4);
        if (uVar7 == 0) {
          warn("no events");
        }
        else {
          if (((uVar7 & 8) != 0) &&
             (wVar9 = *(wchar_t *)((long)&peVar12->events + lVar25), wVar9 == local_210->sock_fss))
          {
            local_198[0].can_family = 0;
            local_198[0]._2_2_ = 0;
            local_198[0].can_ifindex = 0;
            local_198[0].can_addr._0_4_ = 0;
            local_198[0].can_addr._4_4_ = 0;
            local_198[0].can_addr._8_8_ = &local_210->st_msg_stats;
            iVar6 = isobusfs_recv_err(wVar9,local_198);
            if (iVar6 != 0) {
              isobusfs_log(2,"error queue reported error: %i",iVar6);
            }
            uVar7 = *(uint *)((long)peVar12 + lVar25 + -4);
          }
          if ((uVar7 & 1) != 0) {
            iVar6 = *(int *)((long)&peVar12->events + lVar25);
            msg = (isobusfs_msg *)malloc(0x10030);
            if (msg == (isobusfs_msg *)0x0) {
              isobusfs_log(1,"can\'t allocate rx msg struct");
            }
            else {
              msg->buf_size = 0x10000;
              msg->peer_addr_len = 0x18;
              msg->sock = iVar6;
              uVar19 = recvfrom(iVar6,msg,0x10000,0,(sockaddr *)&msg->peername,&msg->peer_addr_len);
              uVar7 = (uint)uVar19;
              if ((int)uVar7 < 0) {
                piVar13 = __errno_location();
                iVar6 = *piVar13;
                strerror(iVar6);
                isobusfs_log(1,"recvfrom(): %i (%s)",iVar6);
              }
              else if (uVar7 < 8) {
                isobusfs_log(2,"buf is less then min transfer: %i < %i. Dropping.",
                             uVar19 & 0xffffffff);
LAB_00103507:
                isobusfs_send_nack(local_210->sock_nack,msg);
              }
              else {
                msg->len = (ulong)(uVar7 & 0x7fffffff);
                _Var2 = (msg->peername).can_addr.j1939.pgn;
                if (_Var2 == 0xe800) {
                  if (msg->buf[0] == '\x01') {
                    isobusfs_log(4,"< rx: NACK!!!!!");
                    isobusfs_dump_tx_data(local_1e8);
                  }
                  else {
                    if (msg->buf[0] != '\0') {
                      pcVar22 = "%s: unsupported ACK control: %i";
                      pcVar21 = "isobusfs_srv_rx_ack";
                      goto LAB_00103679;
                    }
                    isobusfs_log(4,"< rx: ACK?????");
                  }
                }
                else {
                  if (_Var2 == 0xaa00) {
                    bVar1 = msg->buf[0];
                    if (0x4f < bVar1) {
                      isobusfs_log(2,"%s: unsupported command group (%i)","isobusfs_srv_rx_fs");
                      goto LAB_00103507;
                    }
                    piVar14 = isobusfs_srv_get_client
                                        ((isobusfs_srv_priv *)local_210,
                                         (msg->peername).can_addr.j1939.addr);
                    if (piVar14 == (isobusfs_srv_client *)0x0) {
                      isobusfs_log(2,"%s: client not found","isobusfs_srv_rx_fs");
                      goto LAB_00103680;
                    }
                    msg->sock = piVar14->sock;
                    switch(bVar1) {
                    default:
                      wVar9 = isobusfs_srv_rx_cg_cm((isobusfs_srv_priv *)local_210,msg);
                      break;
                    case 0x10:
                    case 0x11:
                    case 0x12:
                    case 0x13:
                    case 0x14:
                    case 0x15:
                    case 0x16:
                    case 0x17:
                    case 0x18:
                    case 0x19:
                    case 0x1a:
                    case 0x1b:
                    case 0x1c:
                    case 0x1d:
                    case 0x1e:
                    case 0x1f:
                      wVar9 = isobusfs_srv_rx_cg_dh(local_210,msg);
                      break;
                    case 0x20:
                    case 0x21:
                    case 0x22:
                    case 0x23:
                    case 0x24:
                    case 0x25:
                    case 0x26:
                    case 0x27:
                    case 0x28:
                    case 0x29:
                    case 0x2a:
                    case 0x2b:
                    case 0x2c:
                    case 0x2d:
                    case 0x2e:
                    case 0x2f:
                      wVar9 = isobusfs_srv_rx_cg_fa((isobusfs_srv_priv *)local_210,msg);
                      break;
                    case 0x30:
                    case 0x31:
                    case 0x32:
                    case 0x33:
                    case 0x34:
                    case 0x35:
                    case 0x36:
                    case 0x37:
                    case 0x38:
                    case 0x39:
                    case 0x3a:
                    case 0x3b:
                    case 0x3c:
                    case 0x3d:
                    case 0x3e:
                    case 0x3f:
                      wVar9 = isobusfs_srv_rx_cg_fh((isobusfs_srv_priv *)local_210,msg);
                      break;
                    case 0x40:
                    case 0x41:
                    case 0x42:
                    case 0x43:
                    case 0x44:
                    case 0x45:
                    case 0x46:
                    case 0x47:
                    case 0x48:
                    case 0x49:
                    case 0x4a:
                    case 0x4b:
                    case 0x4c:
                    case 0x4d:
                    case 0x4e:
                    case 0x4f:
                      wVar9 = isobusfs_srv_rx_cg_vh((isobusfs_srv_priv *)local_210,msg);
                    }
                    if (L'\xffffffff' < wVar9) goto LAB_00103698;
                  }
                  else {
                    pcVar22 = "%s: unsupported PGN: %i";
                    pcVar21 = "isobusfs_srv_rx_buf";
LAB_00103679:
                    isobusfs_log(2,pcVar22,pcVar21);
LAB_00103680:
                    wVar9 = L'\xffffffea';
                  }
                  isobusfs_log(1,"unhandled error by rx buf: %i",wVar9);
                }
              }
LAB_00103698:
              free(msg);
            }
          }
        }
        uVar24 = uVar24 + 1;
        lVar25 = lVar25 + 0xc;
      } while (uVar30 != uVar24);
    }
    isobusfs_srv_remove_timeouted_clients((isobusfs_srv_priv *)local_210);
    iVar6 = isobusfs_srv_fss_send((isobusfs_srv_priv *)local_210);
  } while (iVar6 == 0);
  close((local_210->cmn).epoll_fd);
  free((local_210->cmn).epoll_events);
  close(local_210->sock_fss);
  close(local_210->sock_in);
  close(local_210->sock_nack);
  return iVar6;
}

Assistant:

int main(int argc, char *argv[])
{
	struct isobusfs_srv_priv *priv;
	struct timespec ts;
	int ret;

	/* Allocate memory for the private structure */
	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	/* Clear memory for the private structure */
	memset(priv, 0, sizeof(*priv));

	/* Initialize sockaddr_can with a non-configurable PGN */
	libj1939_init_sockaddr_can(&priv->addr, J1939_NO_PGN);

	priv->server_version = ISOBUSFS_SRV_VERSION;
	/* Parse command line arguments */
	ret = isobusfs_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	/* Prepare sockets for the server */
	ret = isobusfs_srv_sock_prepare(priv);
	if (ret)
		return ret;

	/* Initialize File Server Status structure */
	isobusfs_srv_fss_init(priv);
	/* Initialize client structures */
	isobusfs_srv_init_clients(priv);

	/* Init next st_next_send_time value to avoid warnings */
	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	/* Start the isobusfsd server */
	pr_info("Starting isobusfs-srv");
	while (1) {
		ret = isobusfs_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	/* Close epoll and control sockets */
	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);
	close(priv->sock_fss);
	close(priv->sock_in);
	close(priv->sock_nack);

	return ret;
}